

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O0

bool __thiscall EnvironmentROBARM::InitializeEnvironment(EnvironmentROBARM *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  long lVar6;
  long *in_RDI;
  ulong uVar7;
  unsigned_short endeffy;
  unsigned_short endeffx;
  int i;
  double angles [6];
  double startangles [6];
  unsigned_short coord [6];
  ulong *local_b0;
  undefined2 local_90;
  undefined2 local_8e;
  int local_8c;
  undefined1 local_88 [48];
  double local_58 [7];
  undefined2 local_1c [13];
  bool local_1;
  
  *(undefined4 *)(in_RDI + 0x28) = 0x8000;
  uVar3 = (ulong)(int)in_RDI[0x28];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  puVar5 = puVar5 + 1;
  if (uVar3 != 0) {
    local_b0 = puVar5;
    do {
      std::vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>::vector
                ((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)0x18d203);
      local_b0 = local_b0 + 3;
    } while (local_b0 != puVar5 + uVar3 * 3);
  }
  in_RDI[0x29] = (long)puVar5;
  std::vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_>::clear
            ((vector<ENVROBARMHASHENTRY_*,_std::allocator<ENVROBARMHASHENTRY_*>_> *)0x18d23c);
  for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
    local_58[local_8c] = ((double)in_RDI[(long)local_8c + 0xf] / 180.0) * 3.141592653589793;
  }
  (**(code **)(*in_RDI + 0xe8))(in_RDI,local_58,local_1c);
  (**(code **)(*in_RDI + 0xe0))(in_RDI,local_1c,local_88);
  (**(code **)(*in_RDI + 0xf0))(in_RDI,local_88,&local_8e,&local_90);
  lVar6 = (**(code **)(*in_RDI + 0x198))(in_RDI,local_1c,6,local_8e,local_90);
  in_RDI[0x27] = lVar6;
  for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
    local_1c[local_8c] = 0;
  }
  lVar6 = (**(code **)(*in_RDI + 0x198))
                    (in_RDI,local_1c,6,*(undefined2 *)((long)in_RDI + 0x44),
                     *(undefined2 *)((long)in_RDI + 0x46));
  in_RDI[0x26] = lVar6;
  iVar2 = (**(code **)(*in_RDI + 0xf8))(in_RDI,in_RDI[0x27] + 4,0);
  if (((iVar2 == 0) || ((int)in_RDI[7] <= (int)(uint)*(ushort *)((long)in_RDI + 0x44))) ||
     (*(int *)((long)in_RDI + 0x3c) <= (int)(uint)*(ushort *)((long)in_RDI + 0x46))) {
    local_1 = false;
  }
  else {
    in_RDI[0x2d] = 0;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool EnvironmentROBARM::InitializeEnvironment()
{
    short unsigned int coord[NUMOFLINKS];
    double startangles[NUMOFLINKS];
    double angles[NUMOFLINKS];
    int i;
    short unsigned int endeffx, endeffy;

    //initialize the map from Coord to StateID
    EnvROBARM.HashTableSize = 32 * 1024; //should be power of two
    EnvROBARM.Coord2StateIDHashTable = new vector<EnvROBARMHashEntry_t*> [EnvROBARM.HashTableSize];

    //initialize the map from StateID to Coord
    EnvROBARM.StateID2CoordTable.clear();

    //initialize the angles of the start states
    for (i = 0; i < NUMOFLINKS; i++) {
        startangles[i] = PI_CONST * (EnvROBARMCfg.LinkStartAngles_d[i] / 180.0);
    }

    ComputeCoord(startangles, coord);
    ComputeContAngles(coord, angles);
    ComputeEndEffectorPos(angles, &endeffx, &endeffy);

    //create the start state
    EnvROBARM.startHashEntry = CreateNewHashEntry(coord, NUMOFLINKS, endeffx, endeffy);

    //create the goal state
    //initialize the coord of goal state
    for (i = 0; i < NUMOFLINKS; i++) {
        coord[i] = 0;
    }
    EnvROBARM.goalHashEntry = CreateNewHashEntry(coord, NUMOFLINKS, EnvROBARMCfg.EndEffGoalX_c,
                                                 EnvROBARMCfg.EndEffGoalY_c);

    //check the validity of both goal and start configurations
    //testing for EnvROBARMCfg.EndEffGoalX_c < 0  and EnvROBARMCfg.EndEffGoalY_c < 0 is useless since they are unsigned
    if (!IsValidCoord(EnvROBARM.startHashEntry->coord) || EnvROBARMCfg.EndEffGoalX_c >= EnvROBARMCfg.EnvWidth_c
        || EnvROBARMCfg.EndEffGoalY_c >= EnvROBARMCfg.EnvHeight_c) {
        SBPL_PRINTF("Either start or goal configuration is invalid\n");
        return false;
    }

    //for now heuristics are not set
    EnvROBARM.Heur = NULL;

    return true;
}